

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjpeghandler.cpp
# Opt level: O1

QVariant * __thiscall
QJpegHandler::option(QVariant *__return_storage_ptr__,QJpegHandler *this,ImageOption option)

{
  QJpegHandlerPrivate *pQVar1;
  bool bVar2;
  QIODevice *pQVar3;
  undefined8 uVar4;
  Format FVar5;
  undefined8 uVar6;
  long in_FS_OFFSET;
  QRect QVar7;
  QArrayDataPointer<QByteArray> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  switch(option) {
  case Size:
    pQVar1 = this->d;
    pQVar3 = (QIODevice *)QImageIOHandler::device();
    QJpegHandlerPrivate::readJpegHeader(pQVar1,pQVar3);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      QVariant::QVariant(__return_storage_ptr__,&this->d->size);
      return __return_storage_ptr__;
    }
    break;
  case ClipRect:
    pQVar1 = this->d;
    uVar6._0_4_ = (pQVar1->clipRect).x1;
    uVar6._4_4_ = (pQVar1->clipRect).y1;
    uVar4._0_4_ = (pQVar1->clipRect).x2;
    uVar4._4_4_ = (pQVar1->clipRect).y2;
    goto LAB_001071d6;
  case Description:
    pQVar1 = this->d;
    pQVar3 = (QIODevice *)QImageIOHandler::device();
    QJpegHandlerPrivate::readJpegHeader(pQVar1,pQVar3);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      QVariant::QVariant(__return_storage_ptr__,&this->d->description);
      return __return_storage_ptr__;
    }
    break;
  case ScaledClipRect:
    pQVar1 = this->d;
    uVar6._0_4_ = (pQVar1->scaledClipRect).x1;
    uVar6._4_4_ = (pQVar1->scaledClipRect).y1;
    uVar4._0_4_ = (pQVar1->scaledClipRect).x2;
    uVar4._4_4_ = (pQVar1->scaledClipRect).y2;
LAB_001071d6:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      QVar7.x2.m_i = (int)uVar4;
      QVar7.y2.m_i = (int)((ulong)uVar4 >> 0x20);
      QVar7.x1.m_i = (int)uVar6;
      QVar7.y1.m_i = (int)((ulong)uVar6 >> 0x20);
      QVariant::QVariant(__return_storage_ptr__,QVar7);
      return __return_storage_ptr__;
    }
    break;
  case ScaledSize:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      QVariant::QVariant(__return_storage_ptr__,this->d->scaledSize);
      return __return_storage_ptr__;
    }
    break;
  default:
    (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
    *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
    goto LAB_001072af;
  case Quality:
    FVar5 = this->d->quality;
    goto LAB_001071a9;
  case SubType:
    QByteArray::QByteArray((QByteArray *)&local_38,SupportedJPEGSubtypes[(int)this->d->subType],-1);
    QVariant::QVariant(__return_storage_ptr__,(QByteArray *)&local_38);
    if (&(local_38.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d)->super_QArrayData,1,0x10);
      }
    }
    goto LAB_001072af;
  case ImageFormat:
    pQVar1 = this->d;
    pQVar3 = (QIODevice *)QImageIOHandler::device();
    QJpegHandlerPrivate::readJpegHeader(pQVar1,pQVar3);
    FVar5 = this->d->format;
    goto LAB_001071a9;
  case SupportedSubTypes:
    local_38.size = -0x5555555555555556;
    local_38.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_38.ptr = (QByteArray *)0xaaaaaaaaaaaaaaaa;
    QList<QByteArray>::QList<const_char_(*)[14],_true>
              ((QList<QByteArray> *)&local_38,SupportedJPEGSubtypes,(char (*) [14])"12QJpegHandler")
    ;
    QVariant::QVariant(__return_storage_ptr__,
                       (QMetaTypeInterface *)
                       &QtPrivate::QMetaTypeInterfaceWrapper<QList<QByteArray>>::metaType,&local_38)
    ;
    QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_38);
LAB_001072af:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return __return_storage_ptr__;
    }
    break;
  case OptimizedWrite:
    bVar2 = this->d->optimize;
    goto LAB_0010722a;
  case ProgressiveScanWrite:
    bVar2 = this->d->progressive;
LAB_0010722a:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      QVariant::QVariant(__return_storage_ptr__,bVar2);
      return __return_storage_ptr__;
    }
    break;
  case ImageTransformation:
    pQVar1 = this->d;
    pQVar3 = (QIODevice *)QImageIOHandler::device();
    QJpegHandlerPrivate::readJpegHeader(pQVar1,pQVar3);
    FVar5 = (this->d->transformation).super_QFlagsStorageHelper<QImageIOHandler::Transformation,_4>.
            super_QFlagsStorage<QImageIOHandler::Transformation>.i;
LAB_001071a9:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      QVariant::QVariant(__return_storage_ptr__,FVar5);
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QVariant QJpegHandler::option(ImageOption option) const
{
    switch(option) {
    case Quality:
        return d->quality;
    case ScaledSize:
        return d->scaledSize;
    case ScaledClipRect:
        return d->scaledClipRect;
    case ClipRect:
        return d->clipRect;
    case Description:
        d->readJpegHeader(device());
        return d->description;
    case Size:
        d->readJpegHeader(device());
        return d->size;
    case SubType:
        return QByteArray(SupportedJPEGSubtypes[int(d->subType)]);
    case SupportedSubTypes: {
        QByteArrayList list(std::begin(SupportedJPEGSubtypes),
                            std::end(SupportedJPEGSubtypes));
        return QVariant::fromValue(list);
    }
    case ImageFormat:
        d->readJpegHeader(device());
        return d->format;
    case OptimizedWrite:
        return d->optimize;
    case ProgressiveScanWrite:
        return d->progressive;
    case ImageTransformation:
        d->readJpegHeader(device());
        return int(d->transformation);
    default:
        break;
    }

    return QVariant();
}